

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

string * __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticPrism>::TypeName_abi_cxx11_
          (TPZGeoElRefLess<pzgeom::TPZQuadraticPrism> *this)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  (in_RDI->field_2)._M_allocated_capacity = 0x6974617264617551;
  *(undefined8 *)((long)&in_RDI->field_2 + 6) = 0x6d73697250636974;
  in_RDI->_M_string_length = 0xe;
  (in_RDI->field_2)._M_local_buf[0xe] = '\0';
  return in_RDI;
}

Assistant:

virtual std::string TypeName() const override
    {
		return fGeo.TypeName();
    }